

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references.cpp
# Opt level: O3

void CreateBackwardReferencesDH6
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               ContextLut literal_context_lut,BrotliEncoderParams *params,Hasher *hasher,
               int *dist_cache,size_t *last_insert_len,Command *commands,size_t *num_commands,
               size_t *num_literals)

{
  int *piVar1;
  ulong uVar2;
  ulong *puVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ushort uVar7;
  undefined4 uVar8;
  size_t sVar9;
  size_t sVar10;
  uint32_t *puVar11;
  uint32_t *puVar12;
  BrotliEncoderDictionary *pBVar13;
  ulong uVar14;
  uint64_t uVar15;
  HasherCommon *pHVar16;
  size_t sVar17;
  size_t sVar18;
  PreparedDictionary *pPVar19;
  size_t sVar20;
  BrotliDictionary *pBVar21;
  undefined8 uVar22;
  int iVar23;
  byte bVar24;
  bool bVar25;
  uint32_t uVar26;
  uint uVar27;
  uint uVar28;
  int iVar29;
  long lVar30;
  ulong uVar31;
  size_t sVar32;
  byte bVar33;
  size_t sVar34;
  long lVar35;
  ulong uVar36;
  ulong uVar37;
  uint8_t *puVar38;
  ulong uVar39;
  ulong *puVar40;
  ulong uVar41;
  long lVar42;
  uint8_t *puVar43;
  ulong uVar44;
  bool bVar45;
  uint uVar46;
  uint8_t *s1_orig_5;
  ulong uVar47;
  ulong *puVar48;
  uint *puVar49;
  uint16_t uVar50;
  uint uVar51;
  ulong uVar52;
  ulong uVar53;
  ulong uVar54;
  byte bVar55;
  ulong *puVar56;
  int iVar57;
  long lVar58;
  uint8_t *puVar59;
  ulong uVar60;
  ulong uVar61;
  ulong uVar62;
  ulong uVar63;
  long lVar64;
  long lVar65;
  ulong uVar66;
  uint8_t *puVar67;
  ulong uVar68;
  undefined8 *puVar69;
  ulong uVar70;
  int *piVar71;
  ulong *puVar72;
  uint8_t *s1_orig_1;
  uint16_t *num;
  ulong uVar73;
  ulong local_1c8;
  ulong local_1c0;
  ulong local_1b8;
  ulong local_1b0;
  ulong local_1a8;
  ulong local_1a0;
  int local_18c;
  ulong local_168;
  ulong local_158;
  ulong local_150;
  Command *local_148;
  ulong local_130;
  ulong local_110;
  uint local_100;
  int local_fc;
  ulong local_e8;
  ulong local_d0;
  
  iVar29 = params->lgwin;
  uVar5 = (position - 7) + num_bytes;
  sVar34 = position;
  if (7 < num_bytes) {
    sVar34 = uVar5;
  }
  sVar9 = params->stream_offset;
  lVar35 = 0x200;
  if (params->quality < 9) {
    lVar35 = 0x40;
  }
  uVar44 = *last_insert_len;
  uVar2 = position + num_bytes;
  sVar10 = (params->dictionary).compound.total_size;
  uVar28 = (uint)(hasher->privat)._H35.hb.next_ix;
  if (4 < (int)uVar28) {
    iVar57 = *dist_cache;
    dist_cache[4] = iVar57 + -1;
    dist_cache[5] = iVar57 + 1;
    dist_cache[6] = iVar57 + -2;
    dist_cache[7] = iVar57 + 2;
    *(ulong *)(dist_cache + 8) = CONCAT44(iVar57 + 3,iVar57 + -3);
    if (10 < uVar28) {
      iVar57 = dist_cache[1];
      dist_cache[10] = iVar57 + -1;
      dist_cache[0xb] = iVar57 + 1;
      dist_cache[0xc] = iVar57 + -2;
      dist_cache[0xd] = iVar57 + 2;
      *(ulong *)(dist_cache + 0xe) = CONCAT44(iVar57 + 3,iVar57 + -3);
    }
  }
  if (position + 8 < uVar2) {
    uVar6 = (1L << ((byte)iVar29 & 0x3f)) - 0x10;
    local_158 = lVar35 + position;
    puVar11 = (hasher->privat)._H5.buckets_;
    puVar12 = (hasher->privat)._H6.buckets_;
    lVar30 = sVar10 + 1;
    lVar4 = position - 1;
    local_148 = commands;
    uVar54 = position;
    do {
      uVar60 = uVar6;
      if (uVar54 < uVar6) {
        uVar60 = uVar54;
      }
      uVar36 = sVar9 + uVar54;
      if (uVar6 <= sVar9 + uVar54) {
        uVar36 = uVar6;
      }
      if ((params->dictionary).contextual.context_based == 0) {
        local_100 = 0;
        local_d0 = 0;
      }
      else {
        if (uVar54 == 0) {
          local_d0 = 0;
LAB_002ff161:
          uVar41 = 0;
        }
        else {
          local_d0 = (ulong)ringbuffer[uVar54 - 1 & ringbuffer_mask];
          if (uVar54 == 1) goto LAB_002ff161;
          uVar41 = (ulong)ringbuffer[uVar54 - 2 & ringbuffer_mask];
        }
        local_100 = (uint)(params->dictionary).contextual.context_map
                          [literal_context_lut[uVar41 + 0x100] | literal_context_lut[local_d0]];
      }
      uVar41 = uVar2 - uVar54;
      pBVar13 = (params->dictionary).contextual.dict[local_100];
      uVar14 = (params->dist).max_distance;
      uVar47 = uVar54 & ringbuffer_mask;
      uVar52 = (ulong)(hasher->privat)._H6.num_last_distances_to_check_;
      if (uVar52 != 0) {
        puVar67 = ringbuffer + uVar47;
        local_1b0 = 0x7e4;
        uVar68 = 0;
        uVar61 = 0;
        local_1c0 = 0;
        local_130 = 0;
LAB_002ff1fc:
        uVar31 = (ulong)dist_cache[uVar61];
        if (((uVar31 <= uVar60) && (uVar54 - uVar31 < uVar54)) &&
           (uVar47 + uVar68 <= ringbuffer_mask)) {
          uVar37 = uVar54 - uVar31 & ringbuffer_mask;
          uVar66 = uVar37 + uVar68;
          if ((ringbuffer_mask < uVar66) || (ringbuffer[uVar47 + uVar68] != ringbuffer[uVar66]))
          goto LAB_002ff366;
          puVar38 = ringbuffer + uVar37;
          puVar43 = puVar67;
          puVar59 = puVar38;
          uVar66 = uVar41;
          if (7 < uVar41) {
            lVar42 = 0;
            lVar65 = 0;
LAB_002ff273:
            if (*(ulong *)(puVar67 + lVar42) == *(ulong *)(puVar38 + lVar42)) goto code_r0x002ff280;
            uVar37 = *(ulong *)(puVar38 + lVar42) ^ *(ulong *)(puVar67 + lVar42);
            uVar66 = 0;
            if (uVar37 != 0) {
              for (; (uVar37 >> uVar66 & 1) == 0; uVar66 = uVar66 + 1) {
              }
            }
            uVar66 = (uVar66 >> 3 & 0x1fffffff) - lVar65;
            goto LAB_002ff30b;
          }
          goto LAB_002ff2b3;
        }
        goto LAB_002ff366;
      }
      local_1b0 = 0x7e4;
      local_130 = 0;
      local_1c0 = 0;
      uVar68 = 0;
LAB_002ff387:
      puVar3 = (ulong *)(ringbuffer + uVar47);
      uVar52 = (hasher->privat)._H5.block_size_;
      uVar15 = (hasher->privat)._H6.hash_mul_;
      uVar66 = *(long *)(ringbuffer + uVar47) * uVar15 >> 0x31;
      lVar42 = uVar66 << (*(byte *)((long)&hasher->privat + 0x1c) & 0x3f);
      uVar7 = *(ushort *)((long)puVar11 + uVar66 * 2);
      uVar31 = (ulong)uVar7;
      uVar61 = 0;
      if (uVar52 <= uVar31) {
        uVar61 = uVar31 - uVar52;
      }
      uVar28 = (hasher->privat)._H6.block_mask_;
      if (uVar61 < uVar31) {
        uVar37 = uVar41 - 4;
        piVar1 = (int *)((long)puVar3 + 4);
LAB_002ff41e:
        uVar31 = uVar31 - 1;
        uVar73 = uVar54 - puVar12[lVar42 + (ulong)((uint)uVar31 & uVar28)];
        if (uVar73 <= uVar60) {
          if (uVar47 + uVar68 <= ringbuffer_mask) {
            uVar53 = (ulong)(puVar12[lVar42 + (ulong)((uint)uVar31 & uVar28)] &
                            (uint)ringbuffer_mask);
            if (((ringbuffer_mask < uVar53 + uVar68) ||
                (ringbuffer[uVar47 + uVar68] != ringbuffer[uVar53 + uVar68])) ||
               (*(int *)(ringbuffer + uVar53) != (int)*(long *)(ringbuffer + uVar47)))
            goto LAB_002ff54e;
            puVar43 = ringbuffer + uVar53 + 4;
            uVar53 = uVar37;
            puVar67 = puVar43;
            piVar71 = piVar1;
            if (7 < uVar37) {
              lVar65 = 0;
LAB_002ff4a6:
              if (*(ulong *)((long)piVar1 + lVar65) == *(ulong *)(puVar43 + lVar65))
              goto code_r0x002ff4b8;
              uVar62 = *(ulong *)(puVar43 + lVar65) ^ *(ulong *)((long)piVar1 + lVar65);
              uVar53 = 0;
              if (uVar62 != 0) {
                for (; (uVar62 >> uVar53 & 1) == 0; uVar53 = uVar53 + 1) {
                }
              }
              lVar65 = (uVar53 >> 3 & 0x1fffffff) + lVar65;
              goto LAB_002ff517;
            }
            goto LAB_002ff4cf;
          }
          goto LAB_002ff54e;
        }
      }
LAB_002ff557:
      puVar12[lVar42 + (ulong)(uVar28 & uVar7)] = (uint32_t)uVar54;
      *(ushort *)((long)puVar11 + uVar66 * 2) = uVar7 + 1;
      local_110 = local_1c0;
      if (local_1b0 == 0x7e4) {
        pHVar16 = (hasher->privat)._H6.common_;
        uVar60 = pHVar16->dict_num_lookups;
        local_1a0 = pHVar16->dict_num_matches;
        local_1b0 = 0x7e4;
        if (uVar60 >> 7 <= local_1a0) {
          uVar68 = (ulong)((uint)((int)*puVar3 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
          puVar67 = pBVar13->hash_table_lengths;
          local_1b0 = 0x7e4;
          local_18c = 0;
          bVar45 = true;
LAB_0030062e:
          uVar60 = uVar60 + 1;
          pHVar16->dict_num_lookups = uVar60;
          bVar33 = puVar67[uVar68];
          uVar61 = (ulong)bVar33;
          if ((uVar61 != 0) && (uVar61 <= uVar41)) {
            pBVar21 = pBVar13->words;
            puVar40 = (ulong *)(pBVar21->data +
                               (ulong)pBVar21->offsets_by_length[uVar61] +
                               pBVar13->hash_table_words[uVar68] * uVar61);
            uVar31 = uVar61;
            puVar72 = puVar3;
            if (7 < bVar33) {
              lVar42 = 0;
LAB_0030068d:
              if (*puVar40 == *puVar72) goto code_r0x00300699;
              uVar66 = *puVar72 ^ *puVar40;
              uVar31 = 0;
              if (uVar66 != 0) {
                for (; (uVar66 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
                }
              }
              uVar31 = (uVar31 >> 3 & 0x1fffffff) - lVar42;
              goto LAB_003006f9;
            }
            goto LAB_003006c0;
          }
          goto LAB_0030078e;
        }
        local_18c = 0;
      }
      else {
        local_18c = 0;
      }
LAB_002ff5d1:
      sVar17 = (params->dictionary).compound.num_chunks;
      sVar18 = (params->dictionary).compound.total_size;
      if (sVar17 != 0) {
        sVar32 = 0;
LAB_002ff60a:
        pPVar19 = (params->dictionary).compound.chunks[sVar32];
        bVar33 = (byte)pPVar19->bucket_bits;
        bVar55 = (byte)pPVar19->slot_bits;
        bVar24 = -(char)pPVar19->hash_bits;
        uVar60 = ((*puVar3 << (bVar24 & 0x3f)) >> (bVar24 & 0x3f)) * 0x1fe35a7bd3579bd3 >>
                 (-bVar33 & 0x3f);
        lVar42 = (1L << (bVar55 & 0x3f)) * 4;
        lVar65 = (1L << (bVar33 & 0x3f)) * 2;
        bVar55 = -bVar55;
        puVar69 = (undefined8 *)
                  ((long)&pPVar19[1].magic + (ulong)pPVar19->num_items * 4 + lVar65 + lVar42);
        if (pPVar19->magic != 0xdebcede0) {
          puVar69 = (undefined8 *)*puVar69;
        }
        uVar68 = (uVar36 + sVar18) - (params->dictionary).compound.chunk_offsets[sVar32];
        uVar61 = (ulong)pPVar19->source_size;
        uVar7 = *(ushort *)((long)&pPVar19[1].magic + (uVar60 & 0xffffffff) * 2 + lVar42);
        puVar49 = (uint *)((long)&pPVar19[1].magic +
                          (ulong)((uint)uVar7 +
                                 (&pPVar19[1].magic)
                                 [(uint)((int)uVar60 << (bVar55 & 0x1f)) >> (bVar55 & 0x1f)]) * 4 +
                          lVar65 + lVar42);
        lVar42 = 0;
        uVar60 = local_110;
LAB_002ff6cb:
        uVar31 = (ulong)dist_cache[lVar42];
        if ((uVar68 - uVar61 < uVar31) && (uVar31 <= uVar68)) {
          uVar66 = uVar61 - (uVar68 - uVar31);
          if (uVar41 <= uVar66) {
            uVar66 = uVar41;
          }
          lVar58 = (uVar68 - uVar31) + (long)puVar69;
          puVar72 = puVar3;
          lVar65 = lVar58;
          if (7 < uVar66) {
            lVar65 = 0;
LAB_002ff6fd:
            if (*(ulong *)((long)puVar3 + lVar65) == *(ulong *)(lVar58 + lVar65))
            goto code_r0x002ff70a;
            uVar37 = *(ulong *)(lVar58 + lVar65) ^ *(ulong *)((long)puVar3 + lVar65);
            uVar66 = 0;
            if (uVar37 != 0) {
              for (; (uVar37 >> uVar66 & 1) == 0; uVar66 = uVar66 + 1) {
              }
            }
            uVar66 = (uVar66 >> 3 & 0x1fffffff) + lVar65;
            goto LAB_002ff77d;
          }
          goto LAB_002ff72f;
        }
        goto LAB_002ff7e2;
      }
LAB_002ff95d:
      if (local_1b0 < 0x7e5) {
        uVar44 = uVar44 + 1;
        position = uVar54 + 1;
        if (local_158 < position) {
          if ((uint)((int)lVar35 * 4) + local_158 < position) {
            uVar60 = uVar54 + 0x11;
            if (uVar5 <= uVar54 + 0x11) {
              uVar60 = uVar5;
            }
            if (position < uVar60) {
              uVar28 = (hasher->privat)._H6.block_mask_;
              uVar8 = *(undefined4 *)((long)&(hasher->privat)._H35.hb.table + 4);
              do {
                uVar54 = *(long *)(ringbuffer + (position & ringbuffer_mask)) * uVar15 >> 0x31;
                uVar7 = *(ushort *)((long)puVar11 + uVar54 * 2);
                *(ushort *)((long)puVar11 + uVar54 * 2) = uVar7 + 1;
                puVar12[(uVar54 << ((byte)uVar8 & 0x3f)) + (ulong)(uVar28 & uVar7)] =
                     (uint32_t)position;
                uVar44 = uVar44 + 4;
                position = position + 4;
              } while (position < uVar60);
            }
          }
          else {
            uVar60 = uVar54 + 9;
            if (uVar5 <= uVar54 + 9) {
              uVar60 = uVar5;
            }
            if (position < uVar60) {
              uVar28 = (hasher->privat)._H6.block_mask_;
              uVar8 = *(undefined4 *)((long)&(hasher->privat)._H35.hb.table + 4);
              do {
                uVar54 = *(long *)(ringbuffer + (position & ringbuffer_mask)) * uVar15 >> 0x31;
                uVar7 = *(ushort *)((long)puVar11 + uVar54 * 2);
                *(ushort *)((long)puVar11 + uVar54 * 2) = uVar7 + 1;
                puVar12[(uVar54 << ((byte)uVar8 & 0x3f)) + (ulong)(uVar28 & uVar7)] =
                     (uint32_t)position;
                uVar44 = uVar44 + 2;
                position = position + 2;
              } while (position < uVar60);
            }
          }
        }
      }
      else {
        iVar29 = (hasher->privat)._H6.num_last_distances_to_check_;
        uVar28 = (hasher->privat)._H6.block_mask_;
        uVar8 = *(undefined4 *)((long)&(hasher->privat)._H35.hb.table + 4);
        local_150 = (lVar4 + num_bytes) - uVar54;
        uVar60 = sVar9 + 1 + uVar54;
        local_fc = 0;
        uVar36 = uVar44;
        do {
          uVar47 = uVar6;
          if (uVar60 < uVar6) {
            uVar47 = uVar60;
          }
          uVar68 = uVar41 - 1;
          uVar61 = local_110 - 1;
          if (uVar68 <= local_110 - 1) {
            uVar61 = uVar68;
          }
          if (4 < params->quality) {
            uVar61 = 0;
          }
          uVar31 = uVar54 + 1;
          uVar66 = uVar6;
          if (uVar31 < uVar6) {
            uVar66 = uVar31;
          }
          local_e8 = sVar9 + uVar54 + 1;
          if (uVar6 <= local_e8) {
            local_e8 = uVar6;
          }
          if ((params->dictionary).contextual.context_based != 0) {
            local_100 = (uint)(params->dictionary).contextual.context_map
                              [literal_context_lut[local_d0 + 0x100] |
                               literal_context_lut[ringbuffer[uVar54 & ringbuffer_mask]]];
            local_d0 = (ulong)ringbuffer[uVar54 & ringbuffer_mask];
          }
          uVar37 = uVar31 & ringbuffer_mask;
          pBVar13 = (params->dictionary).contextual.dict[local_100];
          if (iVar29 != 0) {
            puVar67 = ringbuffer + uVar37;
            local_1c8 = 0x7e4;
            uVar73 = 0;
            local_1b8 = 0;
            local_1a0 = 0;
LAB_002ffaf8:
            uVar53 = (ulong)dist_cache[uVar73];
            if (((uVar53 <= uVar66) && (uVar31 - uVar53 < uVar31)) &&
               (uVar37 + uVar61 <= ringbuffer_mask)) {
              uVar39 = uVar31 - uVar53 & ringbuffer_mask;
              uVar62 = uVar39 + uVar61;
              if ((ringbuffer_mask < uVar62) || (ringbuffer[uVar37 + uVar61] != ringbuffer[uVar62]))
              goto LAB_002ffc60;
              puVar38 = ringbuffer + uVar39;
              uVar62 = uVar68;
              puVar43 = puVar38;
              puVar59 = puVar67;
              if (7 < uVar68) {
                lVar65 = 0;
                lVar42 = 0;
LAB_002ffb68:
                if (*(ulong *)(puVar67 + lVar65) == *(ulong *)(puVar38 + lVar65))
                goto code_r0x002ffb75;
                uVar39 = *(ulong *)(puVar38 + lVar65) ^ *(ulong *)(puVar67 + lVar65);
                uVar62 = 0;
                if (uVar39 != 0) {
                  for (; (uVar39 >> uVar62 & 1) == 0; uVar62 = uVar62 + 1) {
                  }
                }
                uVar62 = (uVar62 >> 3 & 0x1fffffff) - lVar42;
                goto LAB_002ffc04;
              }
              goto LAB_002ffba6;
            }
            goto LAB_002ffc60;
          }
          local_1c8 = 0x7e4;
          local_1a0 = 0;
          local_1b8 = 0;
LAB_002ffc89:
          puVar3 = (ulong *)(ringbuffer + uVar37);
          uVar62 = *(long *)(ringbuffer + uVar37) * uVar15 >> 0x31;
          lVar42 = uVar62 << ((byte)uVar8 & 0x3f);
          uVar7 = *(ushort *)((long)puVar11 + uVar62 * 2);
          uVar53 = (ulong)uVar7;
          uVar73 = 0;
          if (uVar52 <= uVar53) {
            uVar73 = uVar53 - uVar52;
          }
          local_1a8 = local_1b8;
          if (uVar73 < uVar53) {
            uVar41 = uVar41 - 5;
            piVar1 = (int *)((long)puVar3 + 4);
LAB_002ffd19:
            uVar53 = uVar53 - 1;
            uVar39 = uVar31 - puVar12[lVar42 + (ulong)((uint)uVar53 &
                                                      (hasher->privat)._H6.block_mask_)];
            local_1a8 = local_1b8;
            if (uVar39 <= uVar66) {
              if (uVar61 + uVar37 <= ringbuffer_mask) {
                uVar63 = (ulong)(puVar12[lVar42 + (ulong)((uint)uVar53 &
                                                         (hasher->privat)._H6.block_mask_)] &
                                (uint)ringbuffer_mask);
                if (((ringbuffer_mask < uVar63 + uVar61) ||
                    (ringbuffer[uVar61 + uVar37] != ringbuffer[uVar63 + uVar61])) ||
                   (*(int *)(ringbuffer + uVar63) != (int)*(long *)(ringbuffer + uVar37)))
                goto LAB_002ffdfa;
                puVar43 = ringbuffer + uVar63 + 4;
                puVar67 = puVar43;
                uVar63 = uVar41;
                piVar71 = piVar1;
                if (7 < uVar41) {
                  lVar65 = 0;
LAB_002ffda3:
                  if (*(ulong *)((long)piVar1 + lVar65) == *(ulong *)(puVar43 + lVar65))
                  goto code_r0x002ffdb0;
                  uVar70 = *(ulong *)(puVar43 + lVar65) ^ *(ulong *)((long)piVar1 + lVar65);
                  uVar63 = 0;
                  if (uVar70 != 0) {
                    for (; (uVar70 >> uVar63 & 1) == 0; uVar63 = uVar63 + 1) {
                    }
                  }
                  lVar65 = (uVar63 >> 3 & 0x1fffffff) + lVar65;
                  goto LAB_002ffe1a;
                }
                goto LAB_002ffdc5;
              }
              goto LAB_002ffdfa;
            }
          }
LAB_002ffe62:
          puVar12[lVar42 + (ulong)(uVar28 & uVar7)] = (uint32_t)uVar31;
          *(ushort *)((long)puVar11 + uVar62 * 2) = uVar7 + 1;
          if (local_1c8 == 0x7e4) {
            pHVar16 = (hasher->privat)._H6.common_;
            uVar41 = pHVar16->dict_num_lookups;
            local_168 = pHVar16->dict_num_matches;
            if (uVar41 >> 7 <= local_168) {
              uVar61 = (ulong)((uint)((int)*puVar3 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
              puVar67 = pBVar13->hash_table_lengths;
              iVar57 = 0;
              local_1c8 = 0x7e4;
              bVar45 = true;
LAB_0030038b:
              uVar41 = uVar41 + 1;
              pHVar16->dict_num_lookups = uVar41;
              bVar33 = puVar67[uVar61];
              uVar66 = (ulong)bVar33;
              if ((uVar66 != 0) && (uVar66 <= uVar68)) {
                pBVar21 = pBVar13->words;
                puVar40 = (ulong *)(pBVar21->data +
                                   (ulong)pBVar21->offsets_by_length[uVar66] +
                                   pBVar13->hash_table_words[uVar61] * uVar66);
                uVar73 = uVar66;
                puVar72 = puVar3;
                if (7 < bVar33) {
                  lVar42 = 0;
LAB_003003f2:
                  if (*puVar40 == *puVar72) goto code_r0x003003fe;
                  uVar53 = *puVar72 ^ *puVar40;
                  uVar73 = 0;
                  if (uVar53 != 0) {
                    for (; (uVar53 >> uVar73 & 1) == 0; uVar73 = uVar73 + 1) {
                    }
                  }
                  uVar73 = (uVar73 >> 3 & 0x1fffffff) - lVar42;
                  goto LAB_00300478;
                }
                goto LAB_00300425;
              }
              goto LAB_003003a9;
            }
            iVar57 = 0;
            local_1c8 = 0x7e4;
          }
          else {
            iVar57 = 0;
          }
LAB_002ffee0:
          if (sVar17 != 0) {
            sVar32 = 0;
LAB_002fff25:
            pPVar19 = (params->dictionary).compound.chunks[sVar32];
            bVar33 = (byte)pPVar19->bucket_bits;
            bVar55 = (byte)pPVar19->slot_bits;
            bVar24 = -(char)pPVar19->hash_bits;
            uVar41 = ((*puVar3 << (bVar24 & 0x3f)) >> (bVar24 & 0x3f)) * 0x1fe35a7bd3579bd3 >>
                     (-bVar33 & 0x3f);
            lVar42 = (1L << (bVar55 & 0x3f)) * 4;
            lVar65 = (1L << (bVar33 & 0x3f)) * 2;
            bVar55 = -bVar55;
            puVar69 = (undefined8 *)
                      ((long)&pPVar19[1].magic + (ulong)pPVar19->num_items * 4 + lVar65 + lVar42);
            if (pPVar19->magic != 0xdebcede0) {
              puVar69 = (undefined8 *)*puVar69;
            }
            sVar20 = (params->dictionary).compound.chunk_offsets[sVar32];
            uVar61 = (local_e8 + sVar18) - sVar20;
            uVar66 = (ulong)pPVar19->source_size;
            uVar7 = *(ushort *)((long)&pPVar19[1].magic + (uVar41 & 0xffffffff) * 2 + lVar42);
            puVar49 = (uint *)((long)&pPVar19[1].magic +
                              (ulong)((uint)uVar7 +
                                     (&pPVar19[1].magic)
                                     [(uint)((int)uVar41 << (bVar55 & 0x1f)) >> (bVar55 & 0x1f)]) *
                              4 + lVar65 + lVar42);
            lVar42 = 0;
            uVar41 = local_1a8;
LAB_0030000e:
            uVar73 = (ulong)dist_cache[lVar42];
            if ((uVar61 - uVar66 < uVar73) && (uVar73 <= uVar61)) {
              uVar53 = uVar66 - (uVar61 - uVar73);
              if (uVar68 <= uVar53) {
                uVar53 = uVar68;
              }
              lVar58 = (uVar61 - uVar73) + (long)puVar69;
              puVar72 = puVar3;
              lVar65 = lVar58;
              if (7 < uVar53) {
                lVar65 = ((uVar47 + sVar18) - sVar20) - uVar73;
                lVar64 = 0;
LAB_0030004d:
                uVar62 = *(ulong *)((long)puVar69 + lVar64 + lVar65);
                if (*(ulong *)((long)puVar3 + lVar64) == uVar62) goto code_r0x0030005b;
                uVar62 = uVar62 ^ *(ulong *)((long)puVar3 + lVar64);
                uVar53 = 0;
                if (uVar62 != 0) {
                  for (; (uVar62 >> uVar53 & 1) == 0; uVar53 = uVar53 + 1) {
                  }
                }
                uVar53 = (uVar53 >> 3 & 0x1fffffff) + lVar64;
                goto LAB_003000b8;
              }
              goto LAB_00300077;
            }
            goto LAB_00300119;
          }
LAB_003002a9:
          if (local_1c8 < local_1b0 + 0xaf) {
            uVar31 = uVar54;
            uVar47 = uVar36;
            local_1a8 = local_110;
            local_e8 = uVar54 + sVar9;
            iVar57 = local_18c;
            if (uVar6 <= uVar54 + sVar9) {
              local_e8 = uVar6;
            }
            break;
          }
          uVar47 = uVar44 + 4;
          local_130 = local_1a0;
          if (local_fc == 3) break;
          uVar47 = uVar36 + 1;
          local_fc = local_fc + 1;
          uVar61 = uVar54 + 9;
          local_150 = local_150 - 1;
          uVar60 = uVar60 + 1;
          local_1b0 = local_1c8;
          local_110 = local_1a8;
          uVar54 = uVar31;
          uVar41 = uVar68;
          uVar36 = uVar47;
          local_18c = iVar57;
        } while (uVar61 < uVar2);
        local_e8 = local_e8 + sVar10;
        if (local_e8 < local_130) {
LAB_00300852:
          uVar44 = local_130 + 0xf;
LAB_00300856:
          if ((local_130 <= local_e8) && (uVar44 != 0)) {
            dist_cache[3] = dist_cache[2];
            uVar22 = *(undefined8 *)dist_cache;
            *(undefined8 *)(dist_cache + 1) = uVar22;
            iVar29 = (int)local_130;
            *dist_cache = iVar29;
            uVar28 = (uint)(hasher->privat)._H35.hb.next_ix;
            if (4 < (int)uVar28) {
              dist_cache[4] = iVar29 + -1;
              dist_cache[5] = iVar29 + 1;
              dist_cache[6] = iVar29 + -2;
              dist_cache[7] = iVar29 + 2;
              dist_cache[8] = iVar29 + -3;
              dist_cache[9] = iVar29 + 3;
              if (10 < uVar28) {
                iVar29 = (int)uVar22;
                dist_cache[10] = iVar29 + -1;
                dist_cache[0xb] = iVar29 + 1;
                dist_cache[0xc] = iVar29 + -2;
                dist_cache[0xd] = iVar29 + 2;
                *(ulong *)(dist_cache + 0xe) = CONCAT44(iVar29 + 3,iVar29 + -3);
              }
            }
          }
        }
        else {
          if (local_130 != (long)*dist_cache) {
            uVar44 = 1;
            if (local_130 != (long)dist_cache[1]) {
              uVar44 = (local_130 + 3) - (long)*dist_cache;
              if (uVar44 < 7) {
                bVar33 = (byte)((int)uVar44 << 2);
                uVar28 = 0x9750468;
              }
              else {
                uVar44 = (local_130 + 3) - (long)dist_cache[1];
                if (6 < uVar44) {
                  uVar44 = 2;
                  if ((local_130 != (long)dist_cache[2]) &&
                     (uVar44 = 3, local_130 != (long)dist_cache[3])) goto LAB_00300852;
                  goto LAB_00300856;
                }
                bVar33 = (byte)((int)uVar44 << 2);
                uVar28 = 0xfdb1ace;
              }
              uVar44 = (ulong)(uVar28 >> (bVar33 & 0x1f) & 0xf);
            }
            goto LAB_00300856;
          }
          uVar44 = 0;
        }
        uVar28 = (uint)uVar47;
        local_148->insert_len_ = uVar28;
        local_148->copy_len_ = iVar57 << 0x19 | (uint)local_1a8;
        uVar60 = (ulong)(params->dist).num_direct_distance_codes;
        uVar54 = uVar60 + 0x10;
        uVar26 = 0;
        if (uVar54 <= uVar44) {
          uVar46 = (params->dist).distance_postfix_bits;
          bVar33 = (byte)uVar46;
          uVar60 = ((4L << (bVar33 & 0x3f)) + (uVar44 - uVar60)) - 0x10;
          uVar51 = 0x1f;
          uVar27 = (uint)uVar60;
          if (uVar27 != 0) {
            for (; uVar27 >> uVar51 == 0; uVar51 = uVar51 - 1) {
            }
          }
          uVar51 = (uVar51 ^ 0xffffffe0) + 0x1f;
          uVar36 = (ulong)((uVar60 >> ((ulong)uVar51 & 0x3f) & 1) != 0);
          lVar42 = (ulong)uVar51 - (ulong)uVar46;
          uVar44 = (~(-1 << (bVar33 & 0x1f)) & uVar27) + uVar54 +
                   (uVar36 + lVar42 * 2 + 0xfffe << (bVar33 & 0x3f)) | lVar42 * 0x400;
          uVar26 = (uint32_t)(uVar60 - (uVar36 + 2 << ((byte)uVar51 & 0x3f)) >> (bVar33 & 0x3f));
        }
        local_148->dist_prefix_ = (uint16_t)uVar44;
        local_148->dist_extra_ = uVar26;
        if (5 < uVar47) {
          if (uVar47 < 0x82) {
            uVar28 = 0x1f;
            uVar46 = (uint)(uVar47 - 2);
            if (uVar46 != 0) {
              for (; uVar46 >> uVar28 == 0; uVar28 = uVar28 - 1) {
              }
            }
            uVar28 = (int)(uVar47 - 2 >> ((char)(uVar28 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                     (uVar28 ^ 0xffffffe0) * 2 + 0x40;
          }
          else if (uVar47 < 0x842) {
            uVar46 = 0x1f;
            if (uVar28 - 0x42 != 0) {
              for (; uVar28 - 0x42 >> uVar46 == 0; uVar46 = uVar46 - 1) {
              }
            }
            uVar28 = (uVar46 ^ 0xffe0) + 0x2a;
          }
          else {
            uVar28 = 0x15;
            if (0x1841 < uVar47) {
              uVar28 = (uint)(ushort)(0x17 - (uVar47 < 0x5842));
            }
          }
        }
        uVar46 = iVar57 + (uint)local_1a8;
        if (uVar46 < 10) {
          uVar51 = uVar46 - 2;
        }
        else if (uVar46 < 0x86) {
          uVar46 = uVar46 - 6;
          uVar51 = 0x1f;
          if (uVar46 != 0) {
            for (; uVar46 >> uVar51 == 0; uVar51 = uVar51 - 1) {
            }
          }
          uVar51 = (uVar46 >> ((char)(uVar51 ^ 0xffffffe0) + 0x1fU & 0x1f)) +
                   (uVar51 ^ 0xffffffe0) * 2 + 0x42;
        }
        else {
          uVar51 = 0x17;
          if (uVar46 < 0x846) {
            uVar51 = 0x1f;
            if (uVar46 - 0x46 != 0) {
              for (; uVar46 - 0x46 >> uVar51 == 0; uVar51 = uVar51 - 1) {
              }
            }
            uVar51 = (uVar51 ^ 0xffe0) + 0x2c;
          }
        }
        uVar7 = (ushort)uVar51;
        uVar50 = (uVar7 & 7) + ((ushort)uVar28 & 7) * 8;
        if ((((uVar44 & 0x3ff) == 0) && ((ushort)uVar28 < 8)) && (uVar7 < 0x10)) {
          if (7 < uVar7) {
            uVar50 = uVar50 + 0x40;
          }
        }
        else {
          iVar29 = ((uVar28 & 0xffff) >> 3) * 3 + ((uVar51 & 0xffff) >> 3);
          uVar50 = uVar50 + ((ushort)(0x520d40 >> ((char)iVar29 * '\x02' & 0x1fU)) & 0xc0) +
                            (short)iVar29 * 0x40 + 0x40;
        }
        local_148->cmd_prefix_ = uVar50;
        *num_literals = *num_literals + uVar47;
        position = local_1a8 + uVar31;
        uVar44 = sVar34;
        if (position < sVar34) {
          uVar44 = position;
        }
        uVar54 = uVar31 + 2;
        if (local_130 < local_1a8 >> 2) {
          uVar60 = position + local_130 * -4;
          if (uVar60 < uVar54) {
            uVar60 = uVar54;
          }
          uVar54 = uVar60;
          if (uVar44 < uVar60) {
            uVar54 = uVar44;
          }
        }
        local_158 = local_1a8 * 2 + uVar31 + lVar35;
        local_148 = local_148 + 1;
        if (uVar54 < uVar44) {
          uVar15 = (hasher->privat)._H6.hash_mul_;
          uVar28 = (hasher->privat)._H6.block_mask_;
          uVar8 = *(undefined4 *)((long)&(hasher->privat)._H35.hb.table + 4);
          do {
            uVar60 = *(long *)(ringbuffer + (uVar54 & ringbuffer_mask)) * uVar15 >> 0x31;
            uVar7 = *(ushort *)((long)puVar11 + uVar60 * 2);
            *(ushort *)((long)puVar11 + uVar60 * 2) = uVar7 + 1;
            puVar12[(uVar60 << ((byte)uVar8 & 0x3f)) + (ulong)(uVar28 & uVar7)] = (uint32_t)uVar54;
            uVar54 = uVar54 + 1;
          } while (uVar44 != uVar54);
          uVar44 = 0;
        }
        else {
          uVar44 = 0;
        }
      }
      uVar54 = position;
    } while (position + 8 < uVar2);
  }
  else {
    local_148 = commands;
  }
  *last_insert_len = (uVar44 + uVar2) - position;
  *num_commands = *num_commands + ((long)local_148 - (long)commands >> 4);
  return;
code_r0x002ff280:
  lVar42 = lVar42 + 8;
  lVar58 = uVar41 + lVar65;
  lVar65 = lVar65 + -8;
  if (lVar58 - 8U < 8) goto code_r0x002ff29a;
  goto LAB_002ff273;
code_r0x002ff29a:
  puVar59 = puVar38 + -lVar65;
  puVar43 = puVar67 + -lVar65;
  uVar66 = lVar65 + uVar41;
LAB_002ff2b3:
  if (uVar66 != 0) {
    uVar37 = 0;
    do {
      uVar73 = uVar37;
      if (puVar59[uVar37] != puVar43[uVar37]) break;
      uVar37 = uVar37 + 1;
      uVar73 = uVar66;
    } while (uVar66 != uVar37);
    puVar59 = puVar59 + uVar73;
  }
  uVar66 = (long)puVar59 - (long)puVar38;
LAB_002ff30b:
  if (((2 < uVar66) || ((uVar61 < 2 && (uVar66 == 2)))) &&
     (uVar37 = uVar66 * 0x87 + 0x78f, local_1b0 < uVar37)) {
    if (uVar61 != 0) {
      uVar37 = uVar37 - ((0x1ca10U >> ((byte)uVar61 & 0xe) & 0xe) + 0x27);
    }
    if (local_1b0 < uVar37) {
      uVar68 = uVar66;
      local_130 = uVar31;
      local_1c0 = uVar66;
      local_1b0 = uVar37;
    }
  }
LAB_002ff366:
  uVar61 = uVar61 + 1;
  if (uVar61 == uVar52) goto LAB_002ff387;
  goto LAB_002ff1fc;
code_r0x002ff4b8:
  uVar53 = uVar53 - 8;
  lVar65 = lVar65 + 8;
  if (uVar53 < 8) goto code_r0x002ff4c6;
  goto LAB_002ff4a6;
code_r0x002ff4c6:
  puVar67 = puVar43 + lVar65;
  piVar71 = (int *)(lVar65 + (long)piVar1);
LAB_002ff4cf:
  if (uVar53 != 0) {
    uVar62 = 0;
    do {
      uVar39 = uVar62;
      if (puVar67[uVar62] != *(uint8_t *)((long)piVar71 + uVar62)) break;
      uVar62 = uVar62 + 1;
      uVar39 = uVar53;
    } while (uVar53 != uVar62);
    puVar67 = puVar67 + uVar39;
  }
  lVar65 = (long)puVar67 - (long)puVar43;
LAB_002ff517:
  uVar53 = lVar65 + 4;
  iVar29 = 0x1f;
  if ((uint)uVar73 != 0) {
    for (; (uint)uVar73 >> iVar29 == 0; iVar29 = iVar29 + -1) {
    }
  }
  uVar62 = (ulong)(iVar29 * -0x1e + 0x780) + uVar53 * 0x87;
  if (local_1b0 < uVar62) {
    uVar68 = uVar53;
    local_130 = uVar73;
    local_1c0 = uVar53;
    local_1b0 = uVar62;
  }
LAB_002ff54e:
  if (uVar31 <= uVar61) goto LAB_002ff557;
  goto LAB_002ff41e;
code_r0x00300699:
  puVar40 = puVar40 + 1;
  puVar72 = puVar72 + 1;
  lVar65 = uVar61 + lVar42;
  lVar42 = lVar42 + -8;
  if (lVar65 - 8U < 8) goto code_r0x003006b3;
  goto LAB_0030068d;
code_r0x003006b3:
  uVar31 = lVar42 + uVar61;
  if (lVar42 + uVar61 != 0) {
LAB_003006c0:
    uVar66 = 0;
    do {
      uVar37 = uVar66;
      if (*(char *)((long)puVar72 + uVar66) != *(char *)((long)puVar40 + uVar66)) break;
      uVar66 = uVar66 + 1;
      uVar37 = uVar31;
    } while (uVar31 != uVar66);
    puVar72 = (ulong *)(uVar37 + (long)puVar72);
  }
  uVar31 = (long)puVar72 - (long)puVar3;
LAB_003006f9:
  if (((uVar31 != 0) && (uVar61 < pBVar13->cutoffTransformsCount + uVar31)) &&
     (uVar61 = (ulong)pBVar13->hash_table_words[uVar68] + lVar30 + uVar36 +
               ((ulong)((uint)(pBVar13->cutoffTransforms >>
                              ((char)(uVar61 - uVar31) * '\x06' & 0x3fU)) & 0x3f) +
                (uVar61 - uVar31) * 4 << (pBVar21->size_bits_by_length[uVar61] & 0x3f)),
     uVar61 <= uVar14)) {
    iVar29 = 0x1f;
    if ((uint)uVar61 != 0) {
      for (; (uint)uVar61 >> iVar29 == 0; iVar29 = iVar29 + -1) {
      }
    }
    uVar66 = (uVar31 * 0x87 - (ulong)(uint)(iVar29 * 0x1e)) + 0x780;
    if (local_1b0 <= uVar66) {
      local_18c = (uint)bVar33 - (int)uVar31;
      local_1a0 = local_1a0 + 1;
      pHVar16->dict_num_matches = local_1a0;
      local_1b0 = uVar66;
      local_130 = uVar61;
      local_110 = uVar31;
    }
  }
LAB_0030078e:
  uVar68 = uVar68 + 1;
  bVar25 = !bVar45;
  bVar45 = false;
  if (bVar25) goto LAB_002ff5d1;
  goto LAB_0030062e;
code_r0x002ff70a:
  uVar66 = uVar66 - 8;
  lVar65 = lVar65 + 8;
  if (uVar66 < 8) goto code_r0x002ff718;
  goto LAB_002ff6fd;
code_r0x002ff718:
  puVar72 = (ulong *)(lVar65 + (long)puVar3);
  lVar65 = lVar58 + lVar65;
LAB_002ff72f:
  if (uVar66 != 0) {
    uVar37 = 0;
    do {
      uVar73 = uVar37;
      if (*(char *)(lVar65 + uVar37) != *(char *)((long)puVar72 + uVar37)) break;
      uVar37 = uVar37 + 1;
      uVar73 = uVar66;
    } while (uVar66 != uVar37);
    lVar65 = lVar65 + uVar73;
  }
  uVar66 = lVar65 - lVar58;
LAB_002ff77d:
  if ((1 < uVar66) && (uVar37 = uVar66 * 0x87 + 0x78f, local_1b0 < uVar37)) {
    if (lVar42 != 0) {
      uVar37 = uVar37 - ((0x1ca10U >> ((byte)lVar42 & 2) & 4) + 0x27);
    }
    if (local_1b0 < uVar37) {
      if (uVar60 < uVar66) {
        uVar60 = uVar66;
      }
      local_18c = 0;
      local_1b0 = uVar37;
      local_130 = uVar31;
      local_110 = uVar66;
    }
  }
LAB_002ff7e2:
  lVar42 = lVar42 + 1;
  if (lVar42 == 4) goto code_r0x002ff7ef;
  goto LAB_002ff6cb;
code_r0x002ff7ef:
  if (uVar7 != 0xffff) {
LAB_002ff7fb:
    uVar28 = *puVar49;
    uVar37 = (ulong)(uVar28 & 0x7fffffff);
    uVar66 = uVar68 - uVar37;
    uVar31 = uVar61 - uVar37;
    if (uVar41 <= uVar61 - uVar37) {
      uVar31 = uVar41;
    }
    if ((((uVar66 <= uVar14) && (uVar47 + uVar60 <= ringbuffer_mask)) && (uVar60 < uVar31)) &&
       (ringbuffer[uVar47 + uVar60] == *(uint8_t *)((long)puVar69 + uVar37 + uVar60))) {
      puVar48 = (ulong *)(uVar37 + (long)puVar69);
      puVar72 = puVar48;
      puVar40 = puVar3;
      if (7 < uVar31) {
        lVar42 = 0;
        puVar56 = puVar48;
LAB_002ff868:
        if (*puVar40 == *puVar56) goto code_r0x002ff873;
        uVar37 = *puVar56 ^ *puVar40;
        uVar31 = 0;
        if (uVar37 != 0) {
          for (; (uVar37 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
          }
        }
        uVar31 = (uVar31 >> 3 & 0x1fffffff) - lVar42;
        goto LAB_002ff8ce;
      }
      goto LAB_002ff89a;
    }
    goto LAB_002ff927;
  }
LAB_002ff933:
  sVar32 = sVar32 + 1;
  if (sVar32 == sVar17) goto LAB_002ff95d;
  goto LAB_002ff60a;
code_r0x002ff873:
  puVar40 = puVar40 + 1;
  puVar56 = puVar56 + 1;
  lVar65 = uVar31 + lVar42;
  lVar42 = lVar42 + -8;
  if (lVar65 - 8U < 8) goto code_r0x002ff88d;
  goto LAB_002ff868;
code_r0x002ff88d:
  uVar31 = uVar31 + lVar42;
  puVar72 = puVar56;
  if (uVar31 != 0) {
LAB_002ff89a:
    puVar56 = (ulong *)((long)puVar72 + uVar31);
    uVar37 = 0;
    do {
      if (*(char *)((long)puVar72 + uVar37) != *(char *)((long)puVar40 + uVar37)) {
        puVar56 = (ulong *)((long)puVar72 + uVar37);
        break;
      }
      uVar37 = uVar37 + 1;
    } while (uVar31 != uVar37);
  }
  uVar31 = (long)puVar56 - (long)puVar48;
LAB_002ff8ce:
  if (3 < uVar31) {
    iVar29 = 0x1f;
    if ((uint)uVar66 != 0) {
      for (; (uint)uVar66 >> iVar29 == 0; iVar29 = iVar29 + -1) {
      }
    }
    uVar37 = (ulong)(iVar29 * -0x1e + 0x780) + uVar31 * 0x87;
    if (local_1b0 < uVar37) {
      local_18c = 0;
      uVar60 = uVar31;
      local_1b0 = uVar37;
      local_130 = uVar66;
      local_110 = uVar31;
    }
  }
LAB_002ff927:
  puVar49 = puVar49 + 1;
  if ((int)uVar28 < 0) goto LAB_002ff933;
  goto LAB_002ff7fb;
code_r0x002ffb75:
  lVar65 = lVar65 + 8;
  lVar58 = local_150 + lVar42;
  lVar42 = lVar42 + -8;
  if (lVar58 - 8U < 8) goto code_r0x002ffb8e;
  goto LAB_002ffb68;
code_r0x002ffb8e:
  puVar43 = puVar38 + -lVar42;
  puVar59 = puVar67 + -lVar42;
  uVar62 = lVar42 + local_150;
LAB_002ffba6:
  if (uVar62 != 0) {
    uVar39 = 0;
    do {
      uVar63 = uVar39;
      if (puVar43[uVar39] != puVar59[uVar39]) break;
      uVar39 = uVar39 + 1;
      uVar63 = uVar62;
    } while (uVar62 != uVar39);
    puVar43 = puVar43 + uVar63;
  }
  uVar62 = (long)puVar43 - (long)puVar38;
LAB_002ffc04:
  if (((2 < uVar62) || ((uVar73 < 2 && (uVar62 == 2)))) &&
     (uVar39 = uVar62 * 0x87 + 0x78f, local_1c8 < uVar39)) {
    if (uVar73 != 0) {
      uVar39 = uVar39 - ((0x1ca10U >> ((byte)uVar73 & 0xe) & 0xe) + 0x27);
    }
    if (local_1c8 < uVar39) {
      uVar61 = uVar62;
      local_1a0 = uVar53;
      local_1c8 = uVar39;
      local_1b8 = uVar62;
    }
  }
LAB_002ffc60:
  uVar73 = uVar73 + 1;
  if (uVar73 == (long)iVar29) goto LAB_002ffc89;
  goto LAB_002ffaf8;
code_r0x002ffdb0:
  uVar63 = uVar63 - 8;
  lVar65 = lVar65 + 8;
  if (uVar63 < 8) goto code_r0x002ffdbe;
  goto LAB_002ffda3;
code_r0x002ffdbe:
  puVar67 = puVar43 + lVar65;
  piVar71 = (int *)(lVar65 + (long)piVar1);
LAB_002ffdc5:
  puVar59 = puVar67;
  if (uVar63 != 0) {
    puVar59 = puVar67 + uVar63;
    uVar70 = 0;
    do {
      if (puVar67[uVar70] != *(uint8_t *)((long)piVar71 + uVar70)) {
        puVar59 = puVar67 + uVar70;
        break;
      }
      uVar70 = uVar70 + 1;
    } while (uVar63 != uVar70);
  }
  lVar65 = (long)puVar59 - (long)puVar43;
LAB_002ffe1a:
  uVar63 = lVar65 + 4;
  iVar57 = 0x1f;
  if ((uint)uVar39 != 0) {
    for (; (uint)uVar39 >> iVar57 == 0; iVar57 = iVar57 + -1) {
    }
  }
  uVar70 = (ulong)(iVar57 * -0x1e + 0x780) + uVar63 * 0x87;
  if (local_1c8 < uVar70) {
    uVar61 = uVar63;
    local_1a0 = uVar39;
    local_1b8 = uVar63;
    local_1c8 = uVar70;
  }
LAB_002ffdfa:
  local_1a8 = local_1b8;
  if (uVar53 <= uVar73) goto LAB_002ffe62;
  goto LAB_002ffd19;
code_r0x003003fe:
  puVar40 = puVar40 + 1;
  puVar72 = puVar72 + 1;
  lVar65 = uVar66 + lVar42;
  lVar42 = lVar42 + -8;
  if (lVar65 - 8U < 8) goto code_r0x00300418;
  goto LAB_003003f2;
code_r0x00300418:
  uVar73 = lVar42 + uVar66;
  if (lVar42 + uVar66 != 0) {
LAB_00300425:
    uVar53 = 0;
    do {
      uVar62 = uVar53;
      if (*(char *)((long)puVar72 + uVar53) != *(char *)((long)puVar40 + uVar53)) break;
      uVar53 = uVar53 + 1;
      uVar62 = uVar73;
    } while (uVar73 != uVar53);
    puVar72 = (ulong *)((long)puVar72 + uVar62);
  }
  uVar73 = (long)puVar72 - (long)puVar3;
LAB_00300478:
  if (((uVar73 != 0) && (uVar66 < pBVar13->cutoffTransformsCount + uVar73)) &&
     (uVar66 = (ulong)pBVar13->hash_table_words[uVar61] + lVar30 + local_e8 +
               ((ulong)((uint)(pBVar13->cutoffTransforms >>
                              ((char)(uVar66 - uVar73) * '\x06' & 0x3fU)) & 0x3f) +
                (uVar66 - uVar73) * 4 << (pBVar21->size_bits_by_length[uVar66] & 0x3f)),
     uVar66 <= uVar14)) {
    iVar23 = 0x1f;
    if ((uint)uVar66 != 0) {
      for (; (uint)uVar66 >> iVar23 == 0; iVar23 = iVar23 + -1) {
      }
    }
    uVar53 = (uVar73 * 0x87 - (ulong)(uint)(iVar23 * 0x1e)) + 0x780;
    if (local_1c8 <= uVar53) {
      iVar57 = (uint)bVar33 - (int)uVar73;
      local_168 = local_168 + 1;
      pHVar16->dict_num_matches = local_168;
      local_1c8 = uVar53;
      local_1a0 = uVar66;
      local_1a8 = uVar73;
    }
  }
LAB_003003a9:
  uVar61 = uVar61 + 1;
  bVar25 = !bVar45;
  bVar45 = false;
  if (bVar25) goto LAB_002ffee0;
  goto LAB_0030038b;
code_r0x0030005b:
  uVar53 = uVar53 - 8;
  lVar64 = lVar64 + 8;
  if (uVar53 < 8) goto code_r0x00300069;
  goto LAB_0030004d;
code_r0x00300069:
  puVar72 = (ulong *)(lVar64 + (long)puVar3);
  lVar65 = (long)puVar69 + lVar64 + lVar65;
LAB_00300077:
  if (uVar53 != 0) {
    uVar62 = 0;
    do {
      uVar39 = uVar62;
      if (*(char *)(lVar65 + uVar62) != *(char *)((long)puVar72 + uVar62)) break;
      uVar62 = uVar62 + 1;
      uVar39 = uVar53;
    } while (uVar53 != uVar62);
    lVar65 = lVar65 + uVar39;
  }
  uVar53 = lVar65 - lVar58;
LAB_003000b8:
  if ((1 < uVar53) && (uVar62 = uVar53 * 0x87 + 0x78f, local_1c8 < uVar62)) {
    if (lVar42 != 0) {
      uVar62 = uVar62 - ((0x1ca10U >> ((byte)lVar42 & 2) & 4) + 0x27);
    }
    if (local_1c8 < uVar62) {
      if (uVar41 < uVar53) {
        uVar41 = uVar53;
      }
      iVar57 = 0;
      local_1c8 = uVar62;
      local_1a8 = uVar53;
      local_1a0 = uVar73;
    }
  }
LAB_00300119:
  lVar42 = lVar42 + 1;
  if (lVar42 == 4) goto code_r0x00300126;
  goto LAB_0030000e;
code_r0x00300126:
  if (uVar7 != 0xffff) {
LAB_00300132:
    uVar46 = *puVar49;
    uVar39 = (ulong)(uVar46 & 0x7fffffff);
    uVar62 = uVar61 - uVar39;
    uVar53 = uVar66 - uVar39;
    uVar73 = uVar68;
    if (uVar53 < uVar68) {
      uVar73 = uVar53;
    }
    if ((((uVar62 <= uVar14) && (uVar37 + uVar41 <= ringbuffer_mask)) && (uVar41 < uVar73)) &&
       (ringbuffer[uVar37 + uVar41] == *(uint8_t *)((long)puVar69 + uVar41 + uVar39))) {
      puVar48 = (ulong *)(uVar39 + (long)puVar69);
      puVar72 = puVar48;
      puVar40 = puVar3;
      if (7 < uVar73) {
        uVar73 = uVar53;
        if (local_150 < uVar53) {
          uVar73 = local_150;
        }
        lVar42 = 0;
        puVar56 = puVar48;
LAB_003001b6:
        if (*puVar40 == *puVar56) goto code_r0x003001c1;
        uVar53 = *puVar56 ^ *puVar40;
        uVar73 = 0;
        if (uVar53 != 0) {
          for (; (uVar53 >> uVar73 & 1) == 0; uVar73 = uVar73 + 1) {
          }
        }
        uVar73 = (uVar73 >> 3 & 0x1fffffff) - lVar42;
        goto LAB_0030022b;
      }
      goto LAB_003001f3;
    }
    goto LAB_0030015e;
  }
LAB_00300281:
  sVar32 = sVar32 + 1;
  if (sVar32 == sVar17) goto LAB_003002a9;
  goto LAB_002fff25;
code_r0x003001c1:
  puVar40 = puVar40 + 1;
  puVar56 = puVar56 + 1;
  lVar65 = uVar73 + lVar42;
  lVar42 = lVar42 + -8;
  if (lVar65 - 8U < 8) goto code_r0x003001db;
  goto LAB_003001b6;
code_r0x003001db:
  if (local_150 < uVar53) {
    uVar53 = local_150;
  }
  uVar73 = uVar53 + lVar42;
  puVar72 = puVar56;
  if (uVar73 != 0) {
LAB_003001f3:
    puVar56 = (ulong *)((long)puVar72 + uVar73);
    uVar53 = 0;
    do {
      if (*(char *)((long)puVar72 + uVar53) != *(char *)((long)puVar40 + uVar53)) {
        puVar56 = (ulong *)((long)puVar72 + uVar53);
        break;
      }
      uVar53 = uVar53 + 1;
    } while (uVar73 != uVar53);
  }
  uVar73 = (long)puVar56 - (long)puVar48;
LAB_0030022b:
  if (3 < uVar73) {
    iVar23 = 0x1f;
    if ((uint)uVar62 != 0) {
      for (; (uint)uVar62 >> iVar23 == 0; iVar23 = iVar23 + -1) {
      }
    }
    uVar53 = (ulong)(iVar23 * -0x1e + 0x780) + uVar73 * 0x87;
    if (local_1c8 < uVar53) {
      iVar57 = 0;
      uVar41 = uVar73;
      local_1c8 = uVar53;
      local_1a8 = uVar73;
      local_1a0 = uVar62;
    }
  }
LAB_0030015e:
  puVar49 = puVar49 + 1;
  if ((int)uVar46 < 0) goto LAB_00300281;
  goto LAB_00300132;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals) {
  HASHER()* privat = &hasher->privat.FN(_);
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t position_offset = params->stream_offset;

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = params->dictionary.compound.total_size;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  FN(PrepareDistanceCache)(privat, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    size_t dictionary_start = BROTLI_MIN(size_t,
        position + position_offset, max_backward_limit);
    HasherSearchResult sr;
    int dict_id = 0;
    uint8_t p1 = 0;
    uint8_t p2 = 0;
    if (params->dictionary.contextual.context_based) {
      p1 = position >= 1 ?
          ringbuffer[(size_t)(position - 1) & ringbuffer_mask] : 0;
      p2 = position >= 2 ?
          ringbuffer[(size_t)(position - 2) & ringbuffer_mask] : 0;
      dict_id = params->dictionary.contextual.context_map[
          BROTLI_CONTEXT(p1, p2, literal_context_lut)];
    }
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    FN(FindLongestMatch)(privat, params->dictionary.contextual.dict[dict_id],
        ringbuffer, ringbuffer_mask, dist_cache, position, max_length,
        max_distance, dictionary_start + gap, params->dist.max_distance, &sr);
    if (ENABLE_COMPOUND_DICTIONARY) {
      LookupCompoundDictionaryMatch(&params->dictionary.compound, ringbuffer,
          ringbuffer_mask, dist_cache, position, max_length,
          dictionary_start, params->dist.max_distance, &sr);
    }
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      for (;; --max_length) {
        const score_t cost_diff_lazy = 175;
        HasherSearchResult sr2;
        sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
            BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
        sr2.len_code_delta = 0;
        sr2.distance = 0;
        sr2.score = kMinScore;
        max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
        dictionary_start = BROTLI_MIN(size_t,
            position + 1 + position_offset, max_backward_limit);
        if (params->dictionary.contextual.context_based) {
          p2 = p1;
          p1 = ringbuffer[position & ringbuffer_mask];
          dict_id = params->dictionary.contextual.context_map[
              BROTLI_CONTEXT(p1, p2, literal_context_lut)];
        }
        FN(FindLongestMatch)(privat,
            params->dictionary.contextual.dict[dict_id],
            ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
            max_distance, dictionary_start + gap, params->dist.max_distance,
            &sr2);
        if (ENABLE_COMPOUND_DICTIONARY) {
          LookupCompoundDictionaryMatch(
              &params->dictionary.compound, ringbuffer,
              ringbuffer_mask, dist_cache, position + 1, max_length,
              dictionary_start, params->dist.max_distance, &sr2);
        }
        if (sr2.score >= sr.score + cost_diff_lazy) {
          /* Ok, let's just write one byte for now and start a match from the
             next byte. */
          ++position;
          ++insert_length;
          sr = sr2;
          if (++delayed_backward_references_in_row < 4 &&
              position + FN(HashTypeLength)() < pos_end) {
            continue;
          }
        }
        break;
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      dictionary_start = BROTLI_MIN(size_t,
          position + position_offset, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code = ComputeDistanceCode(
            sr.distance, dictionary_start + gap, dist_cache);
        if ((sr.distance <= (dictionary_start + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(privat, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(privat, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}